

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testActive(DefaultsTest *this)

{
  TestContext *pTVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  GLint local_1c;
  DefaultsTest *pDStack_18;
  GLint is_active;
  DefaultsTest *this_local;
  
  local_1c = -1;
  pDStack_18 = this;
  (*this->m_gl_getTransformFeedbackiv)(this->m_xfb_dsa,0x8e24,&local_1c);
  if (local_1c == -1) {
    pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    tcu::TestLog::operator<<(&local_1a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [129])
                        "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has not returned anything and error has not been generated."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    this_local._7_1_ = false;
  }
  else if (local_1c == 0) {
    this_local._7_1_ = true;
  }
  else {
    pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    tcu::TestLog::operator<<(&local_330,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_330,
                        (char (*) [83])
                        "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has returned "
                       );
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [29])", however FALSE is expected.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultsTest::testActive()
{
	/* Check that it is not active. */
	glw::GLint is_active = -1;
	m_gl_getTransformFeedbackiv(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_ACTIVE, &is_active);

	if (-1 == is_active)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE "
											   "has not returned anything and error has not been generated."
											<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (0 != is_active)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has returned " << is_active
				<< ", however FALSE is expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}